

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value chaiscript::Boxed_Number::unary_go<float>(Opers t_oper,float *t,Boxed_Value *t_lhs)

{
  undefined8 uVar1;
  float *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffffb8;
  Boxed_Value *in_stack_ffffffffffffffc0;
  
  if (in_ESI == 9) {
    *in_RDX = *in_RDX + 1.0;
  }
  else {
    if (in_ESI != 10) {
      uVar1 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast((bad_any_cast *)in_RDI);
      __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    *in_RDX = *in_RDX + -1.0;
  }
  Boxed_Value::Boxed_Value(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value unary_go(Operators::Opers t_oper, T &t, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::pre_increment:
            ++t;
            break;
          case Operators::pre_decrement:
            --t;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }